

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O1

BlockIterator<helics::Input,_32,_helics::Input_**> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
          (BlockIterator<helics::Input,_32,_helics::Input_**> *__return_storage_ptr__,
          DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
          *this,InterfaceHandle *searchValue)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  Input **ppIVar4;
  int iVar5;
  Input *pIVar6;
  _Base_ptr p_Var7;
  
  p_Var3 = (this->lookup2)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->lookup2)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (searchValue->hid <= (int)p_Var3[1]._M_color) {
        p_Var7 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < searchValue->hid];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (p_Var3 = p_Var7, searchValue->hid < (int)p_Var7[1]._M_color)) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
              (__return_storage_ptr__,&this->dataStorage);
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar5 = (this->dataStorage).bsize;
    ppIVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 != 0x20) {
      ppIVar4 = ppIVar4 + (this->dataStorage).dataSlotIndex;
      pIVar6 = *ppIVar4 + iVar5;
      goto LAB_00215c6f;
    }
    if (ppIVar4 == (Input **)0x0) {
      ppIVar4 = &StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                 emptyValue;
    }
    else {
      ppIVar4 = ppIVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppIVar4 = (this->dataStorage).dataptr;
  }
  pIVar6 = *ppIVar4;
  iVar5 = 0;
LAB_00215c6f:
  p_Var3 = p_Var3[1]._M_parent;
  __return_storage_ptr__->vec = ppIVar4;
  __return_storage_ptr__->ptr = pIVar6 + (long)p_Var3;
  uVar2 = (int)p_Var3 + iVar5;
  __return_storage_ptr__->offset = uVar2;
  if (0x1f < (int)uVar2) {
    __return_storage_ptr__->vec = ppIVar4 + (ulong)(uVar2 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar2 & 0x1f;
    __return_storage_ptr__->ptr = ppIVar4[(ulong)(uVar2 - 0x20 >> 5) + 1] + (uVar2 & 0x1f);
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(const searchType2& searchValue)
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }